

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::RunContext::invokeTestCase(TestCase *testCase)

{
  FatalConditionHandler local_11;
  TestCase *pTStack_10;
  FatalConditionHandler fatalConditionHandler;
  TestCase *testCase_local;
  
  pTStack_10 = testCase;
  FatalConditionHandler::FatalConditionHandler(&local_11);
  TestCase::invoke(pTStack_10);
  FatalConditionHandler::reset(&local_11);
  FatalConditionHandler::~FatalConditionHandler(&local_11);
  return;
}

Assistant:

static void invokeTestCase( TestCase const& testCase ) {
            FatalConditionHandler fatalConditionHandler; // Handle signals
            testCase.invoke();
            fatalConditionHandler.reset(); // Not strictly needed but avoids warnings
        }